

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O0

string * __thiscall TileSwitch::toString_abi_cxx11_(TileSwitch *this)

{
  const_reference pvVar1;
  long in_RSI;
  string *in_RDI;
  string *s;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&INPUT_SYMBOL_TABLE_abi_cxx11_,(long)(*(int *)(in_RSI + 0x24) + -1));
  std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  std::__cxx11::string::push_back((char)in_RDI);
  return in_RDI;
}

Assistant:

string TileSwitch::toString() const {
    string s(INPUT_SYMBOL_TABLE[_state - 1]);
    s.push_back(_charID);
    return s;
}